

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O0

string * __thiscall cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(cmSourceFile *this)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  undefined1 local_40 [8];
  string ext;
  cmValue lang;
  cmSourceFile *this_local;
  
  ext.field_2._8_8_ = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&ext.field_2 + 8));
  if (bVar1) {
    psVar3 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&ext.field_2 + 8));
    std::__cxx11::string::operator=((string *)&this->Language,(string *)psVar3);
  }
  else {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) != 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((((uVar2 & 1) == 0) ||
          (bVar1 = cmSourceFileLocation::ExtensionIsAmbiguous(&this->Location), !bVar1)) ||
         (bVar1 = cmSourceFileLocation::DirectoryIsAmbiguous(&this->Location), !bVar1)) {
        psVar3 = cmSourceFileLocation::GetName_abi_cxx11_(&this->Location);
        cmsys::SystemTools::GetFilenameLastExtension((string *)local_40,psVar3);
        CheckLanguage(this,(string *)local_40);
        std::__cxx11::string::~string((string *)local_40);
      }
      else {
        ResolveFullPath(this,(string *)0x0,(string *)0x0);
      }
    }
  }
  this_local = (cmSourceFile *)&this->Language;
  return (string *)this_local;
}

Assistant:

std::string const& cmSourceFile::GetOrDetermineLanguage()
{
  // If the language was set explicitly by the user then use it.
  if (cmValue lang = this->GetProperty(propLANGUAGE)) {
    // Assign to member in order to return a reference.
    this->Language = *lang;
    return this->Language;
  }

  // Perform computation needed to get the language if necessary.
  if (this->Language.empty()) {
    // If a known extension is given or a known full path is given then trust
    // that the current extension is sufficient to determine the language. This
    // will fail only if the user specifies a full path to the source but
    // leaves off the extension, which is kind of weird.
    if (this->FullPath.empty() && this->Location.ExtensionIsAmbiguous() &&
        this->Location.DirectoryIsAmbiguous()) {
      // Finalize the file location to get the extension and set the language.
      this->ResolveFullPath();
    } else {
      // Use the known extension to get the language if possible.
      std::string ext =
        cmSystemTools::GetFilenameLastExtension(this->Location.GetName());
      this->CheckLanguage(ext);
    }
  }

  // Use the language determined from the file extension.
  return this->Language;
}